

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmValue __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __type _Var1;
  bool bVar2;
  int iVar3;
  TargetType targetType;
  size_type sVar4;
  pointer ppVar5;
  size_type __new_size;
  string *psVar6;
  pointer pcVar7;
  pointer pcVar8;
  cmState *this_01;
  cmValue cVar9;
  pair<bool,_cmValue> pVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6e8;
  cmStateSnapshot local_6d0;
  cmStateDirectory local_6b8;
  byte local_689;
  cmValue cStack_688;
  bool chain;
  cmValue retVal;
  pair<bool,_cmValue> cxx_module_headers;
  pair<bool,_cmValue> cxx_modules;
  pair<bool,_cmValue> headers;
  cmStateDirectory local_638;
  cmStateSnapshot local_610;
  cmStateDirectory local_5f8;
  string_view local_5d0;
  string local_5c0;
  string_view local_5a0;
  string_view local_590;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_550;
  _Base_ptr local_548;
  _Base_ptr local_540;
  string_view local_538;
  string local_528;
  string_view local_508;
  string local_4f8;
  string_view local_4d8;
  string local_4c8;
  string_view local_4a8;
  string local_498;
  string_view local_478;
  string local_468;
  string_view local_448;
  string local_438;
  string_view local_418;
  string local_408;
  string_view local_3e8;
  string local_3d8;
  string_view local_3b8;
  string local_3a8;
  string_view local_388;
  string local_378;
  _Self local_358;
  _Self local_350;
  iterator propertyIter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  string *prop_local;
  cmTarget *this_local;
  
  local_20 = (undefined1  [8])prop;
  prop_local = (string *)this;
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar3 != 0)) {
    std::__cxx11::string::string
              ((string *)&local_330,(string *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_310,(string *)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_2f0,(string *)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_2d0,(string *)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_2b0,(string *)(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_290,(string *)(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    std::__cxx11::string::string(local_270,(string *)(anonymous_namespace)::propTYPE_abi_cxx11_);
    std::__cxx11::string::string
              (local_250,(string *)(anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_230,(string *)(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
    std::__cxx11::string::string
              (local_210,(string *)(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_1f0,(string *)(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_1d0,(string *)(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
    std::__cxx11::string::string
              (local_1b0,(string *)(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_190,(string *)(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string(local_170,(string *)(anonymous_namespace)::propIMPORTED_abi_cxx11_)
    ;
    std::__cxx11::string::string
              (local_150,(string *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
    std::__cxx11::string::string
              (local_130,(string *)(anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
              );
    std::__cxx11::string::string(local_110,(string *)(anonymous_namespace)::propNAME_abi_cxx11_);
    std::__cxx11::string::string
              (local_f0,(string *)(anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
    std::__cxx11::string::string
              (local_d0,(string *)(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
    std::__cxx11::string::string(local_b0,(string *)(anonymous_namespace)::propSOURCES_abi_cxx11_);
    std::__cxx11::string::string
              (local_90,(string *)(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_70,(string *)
                        (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
    std::__cxx11::string::string
              (local_50,(string *)
                        (anonymous_namespace)::
                        propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
    local_30 = &local_330;
    local_28 = 0x18;
    this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&propertyIter._M_node + 1);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_00);
    __l._M_len = local_28;
    __l._M_array = local_30;
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,__l,0,
                    (hasher *)((long)&propertyIter._M_node + 3),
                    (key_equal *)((long)&propertyIter._M_node + 2),this_00);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&propertyIter._M_node + 1));
    local_6e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
    do {
      local_6e8 = local_6e8 + -1;
      std::__cxx11::string::~string((string *)local_6e8);
    } while (local_6e8 != &local_330);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  sVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                  (key_type *)local_20);
  if (sVar4 != 0) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    if ((((_Var1) ||
         (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_20,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_), _Var1)) ||
        (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_20,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_), _Var1)) ||
       ((_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_20,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_), _Var1 ||
        (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_20,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_), _Var1)))
       ) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      local_350._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::find(&pcVar7->LanguageStandardProperties,(key_type *)local_20);
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      local_358._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::end(&pcVar7->LanguageStandardProperties);
      bVar2 = std::operator==(&local_350,&local_358);
      if (!bVar2) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator->(&local_350);
        cmValue::cmValue((cmValue *)&this_local,&(ppVar5->second).Value);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->LinkImplementationPropertyEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_388,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_378,&pcVar7->LinkImplementationPropertyEntries,local_388);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->LinkInterfacePropertyEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b8,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_3a8,&pcVar7->LinkInterfacePropertyEntries,local_3b8);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->LinkInterfaceDirectPropertyEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3e8,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_3d8,&pcVar7->LinkInterfaceDirectPropertyEntries,local_3e8);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->LinkInterfaceDirectExcludePropertyEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_418,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_408,&pcVar7->LinkInterfaceDirectExcludePropertyEntries,local_418);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_408);
        std::__cxx11::string::~string((string *)&local_408);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propTYPE_abi_cxx11_);
    if (_Var1) {
      targetType = GetType(this);
      psVar6 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
      cmValue::cmValue((cmValue *)&this_local,psVar6);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->IncludeDirectoriesEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_448,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_438,&pcVar7->IncludeDirectoriesEntries,local_448);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_438);
        std::__cxx11::string::~string((string *)&local_438);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->CompileFeaturesEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_478,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_468,&pcVar7->CompileFeaturesEntries,local_478);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_468);
        std::__cxx11::string::~string((string *)&local_468);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->CompileOptionsEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4a8,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_498,&pcVar7->CompileOptionsEntries,local_4a8);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_498);
        std::__cxx11::string::~string((string *)&local_498);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->CompileDefinitionsEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4d8,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_4c8,&pcVar7->CompileDefinitionsEntries,local_4d8);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4c8);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->LinkOptionsEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_508,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_4f8,&pcVar7->LinkOptionsEntries,local_508);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->LinkDirectoriesEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_538,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_528,&pcVar7->LinkDirectoriesEntries,local_538);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_528);
        std::__cxx11::string::~string((string *)&local_528);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
              ::empty(&pcVar7->Utilities);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        if ((GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                         utilities_abi_cxx11_), iVar3 != 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
          __cxa_atexit(std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::~vector,&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        __new_size = std::
                     set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                     ::size(&pcVar7->Utilities);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,__new_size);
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        local_540 = (_Base_ptr)
                    std::
                    set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                    ::cbegin(&pcVar7->Utilities);
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        local_548 = (_Base_ptr)
                    std::
                    set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                    ::cend(&pcVar7->Utilities);
        local_550 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
        local_560 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    transform<std::_Rb_tree_const_iterator<BT<std::pair<std::__cxx11::string,bool>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmTarget::GetProperty(std::__cxx11::string_const&)const::__0>
                              (local_540,local_548,local_550);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_590,";");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5a0);
        cmJoin(&local_580,&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,local_590,
               local_5a0);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_580);
        std::__cxx11::string::~string((string *)&local_580);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar7->PrecompileHeadersEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5d0,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_5c0,&pcVar7->PrecompileHeadersEntries,local_5d0);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_5c0);
        std::__cxx11::string::~string((string *)&local_5c0);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propIMPORTED_abi_cxx11_);
    if (_Var1) {
      bVar2 = IsImported(this);
      if (!bVar2) {
        cmValue::cmValue((cmValue *)&this_local,
                         (string *)(anonymous_namespace)::propFALSE_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(string *)(anonymous_namespace)::propTRUE_abi_cxx11_);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
    if (_Var1) {
      bVar2 = IsImportedGloballyVisible(this);
      if (!bVar2) {
        cmValue::cmValue((cmValue *)&this_local,
                         (string *)(anonymous_namespace)::propFALSE_abi_cxx11_);
        return (cmValue)(string *)this_local;
      }
      cmValue::cmValue((cmValue *)&this_local,(string *)(anonymous_namespace)::propTRUE_abi_cxx11_);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propNAME_abi_cxx11_);
    if (_Var1) {
      psVar6 = GetName_abi_cxx11_(this);
      cmValue::cmValue((cmValue *)&this_local,psVar6);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmMakefile::GetStateSnapshot(&local_610,pcVar7->Makefile);
      cmStateSnapshot::GetDirectory(&local_5f8,&local_610);
      psVar6 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_5f8);
      cmValue::cmValue((cmValue *)&this_local,psVar6);
      return (cmValue)(string *)this_local;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
    if (_Var1) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmMakefile::GetStateSnapshot((cmStateSnapshot *)&headers.second,pcVar7->Makefile);
      cmStateSnapshot::GetDirectory(&local_638,(cmStateSnapshot *)&headers.second);
      psVar6 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_638);
      cmValue::cmValue((cmValue *)&this_local,psVar6);
      return (cmValue)(string *)this_local;
    }
  }
  pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::get
                     (&this->impl);
  pVar10 = anon_unknown.dwarf_2bae81::FileSetType::ReadProperties
                     (&pcVar7->HeadersFileSets,this,pcVar8,(string *)local_20);
  headers._0_8_ = pVar10.second.Value;
  cVar9.Value = (string *)headers._0_8_;
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::get
                       (&this->impl);
    pVar10 = anon_unknown.dwarf_2bae81::FileSetType::ReadProperties
                       (&pcVar7->CxxModulesFileSets,this,pcVar8,(string *)local_20);
    cVar9.Value = pVar10.second.Value.Value;
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::get
                         (&this->impl);
      pVar10 = anon_unknown.dwarf_2bae81::FileSetType::ReadProperties
                         (&pcVar7->CxxModuleHeadersFileSets,this,pcVar8,(string *)local_20);
      retVal.Value._0_1_ = pVar10.first;
      cVar9.Value = pVar10.second.Value.Value;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cStack_688 = cmPropertyMap::GetPropertyValue(&pcVar7->Properties,(string *)local_20);
        bVar2 = cmValue::operator_cast_to_bool(&stack0xfffffffffffff978);
        if (bVar2) {
          this_local = (cmTarget *)cStack_688.Value;
          cVar9.Value = (string *)this_local;
        }
        else {
          pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl);
          this_01 = cmMakefile::GetState(pcVar7->Makefile);
          local_689 = cmState::IsPropertyChained(this_01,(string *)local_20,TARGET);
          if ((bool)local_689) {
            pcVar7 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                     operator->(&this->impl);
            cmMakefile::GetStateSnapshot(&local_6d0,pcVar7->Makefile);
            cmStateSnapshot::GetDirectory(&local_6b8,&local_6d0);
            cVar9 = cmStateDirectory::GetProperty
                              (&local_6b8,(string *)local_20,(bool)(local_689 & 1));
          }
          else {
            cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
            cVar9.Value = (string *)this_local;
          }
        }
      }
    }
  }
  this_local = (cmTarget *)cVar9.Value;
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmTarget::GetProperty(const std::string& prop) const
{
  static std::unordered_set<std::string> const specialProps{
    propC_STANDARD,
    propCXX_STANDARD,
    propCUDA_STANDARD,
    propOBJC_STANDARD,
    propOBJCXX_STANDARD,
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propPRECOMPILE_HEADERS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES,
    propINTERFACE_LINK_LIBRARIES,
    propINTERFACE_LINK_LIBRARIES_DIRECT,
    propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
  };
  if (specialProps.count(prop)) {
    if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
        prop == propCUDA_STANDARD || prop == propOBJC_STANDARD ||
        prop == propOBJCXX_STANDARD) {
      auto propertyIter = this->impl->LanguageStandardProperties.find(prop);
      if (propertyIter == this->impl->LanguageStandardProperties.end()) {
        return nullptr;
      }
      return cmValue(propertyIter->second.Value);
    }
    if (prop == propLINK_LIBRARIES) {
      if (this->impl->LinkImplementationPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkImplementationPropertyEntries, ";");
      return cmValue(output);
    }
    if (prop == propINTERFACE_LINK_LIBRARIES) {
      if (this->impl->LinkInterfacePropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkInterfacePropertyEntries, ";");
      return cmValue(output);
    }
    if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
      if (this->impl->LinkInterfaceDirectPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkInterfaceDirectPropertyEntries, ";");
      return cmValue(output);
    }
    if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
      if (this->impl->LinkInterfaceDirectExcludePropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output =
        cmJoin(this->impl->LinkInterfaceDirectExcludePropertyEntries, ";");
      return cmValue(output);
    }
    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmValue(cmState::GetTargetTypeName(this->GetType()));
    }
    if (prop == propINCLUDE_DIRECTORIES) {
      if (this->impl->IncludeDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->IncludeDirectoriesEntries, ";");
      return cmValue(output);
    }
    if (prop == propCOMPILE_FEATURES) {
      if (this->impl->CompileFeaturesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->CompileFeaturesEntries, ";");
      return cmValue(output);
    }
    if (prop == propCOMPILE_OPTIONS) {
      if (this->impl->CompileOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->CompileOptionsEntries, ";");
      return cmValue(output);
    }
    if (prop == propCOMPILE_DEFINITIONS) {
      if (this->impl->CompileDefinitionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->CompileDefinitionsEntries, ";");
      return cmValue(output);
    }
    if (prop == propLINK_OPTIONS) {
      if (this->impl->LinkOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkOptionsEntries, ";");
      return cmValue(output);
    }
    if (prop == propLINK_DIRECTORIES) {
      if (this->impl->LinkDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkDirectoriesEntries, ";");

      return cmValue(output);
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (this->impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      static std::vector<std::string> utilities;
      utilities.resize(this->impl->Utilities.size());
      std::transform(
        this->impl->Utilities.cbegin(), this->impl->Utilities.cend(),
        utilities.begin(),
        [](const BT<std::pair<std::string, bool>>& item) -> std::string {
          return item.Value.first;
        });
      output = cmJoin(utilities, ";");
      return cmValue(output);
    }
    if (prop == propPRECOMPILE_HEADERS) {
      if (this->impl->PrecompileHeadersEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->PrecompileHeadersEntries, ";");
      return cmValue(output);
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? cmValue(propTRUE) : cmValue(propFALSE);
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? cmValue(propTRUE)
                                               : cmValue(propFALSE);
    }
    if (prop == propNAME) {
      return cmValue(this->GetName());
    }
    if (prop == propBINARY_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentBinary());
    }
    if (prop == propSOURCE_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentSource());
    }
  }

  // Check fileset properties.
  {
    auto headers =
      this->impl->HeadersFileSets.ReadProperties(this, this->impl.get(), prop);
    if (headers.first) {
      return headers.second;
    }
    auto cxx_modules = this->impl->CxxModulesFileSets.ReadProperties(
      this, this->impl.get(), prop);
    if (cxx_modules.first) {
      return cxx_modules.second;
    }
    auto cxx_module_headers =
      this->impl->CxxModuleHeadersFileSets.ReadProperties(
        this, this->impl.get(), prop);
    if (cxx_module_headers.first) {
      return cxx_module_headers.second;
    }
  }

  cmValue retVal = this->impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain = this->impl->Makefile->GetState()->IsPropertyChained(
      prop, cmProperty::TARGET);
    if (chain) {
      return this->impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetProperty(prop, chain);
    }
    return nullptr;
  }
  return retVal;
}